

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionNextChar.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionNextChar::write_cpp
          (InstructionNextChar *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  StreamSep *pSVar4;
  ulong uVar5;
  StreamSepMaker *pSVar6;
  uint cont_label;
  StreamSepMaker *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  StreamSepMaker local_408;
  StreamSep local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  undefined1 local_2b8 [144];
  StreamSep local_228;
  StreamSep local_1e0;
  StreamSep local_198;
  StreamSep local_150;
  undefined1 local_108 [144];
  StreamSep local_78;
  
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if (bVar1) {
    cont_label = cpp_emitter->nb_cont_label + 1;
    cpp_emitter->nb_cont_label = cont_label;
    local_430 = ss;
    StreamSepMaker::operator<<((StreamSep *)&local_408,ss,(char (*) [11])"if ( data ");
    local_380.stream = (TS *)0x178a39;
    if ((this->super_Instruction).field_0x174 != '\0') {
      local_380.stream = (TS *)0x176648;
    }
    pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(char **)&local_380);
    pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x179416);
    pSVar4 = StreamSep::operator<<(pSVar4,&cont_label);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
    StreamSep::~StreamSep((StreamSep *)&local_408);
    if ((this->super_Instruction).field_0x174 == '\0') {
      StreamSepMaker::operator<<(&local_78,local_430,(char (*) [8])"++data;");
      StreamSep::~StreamSep(&local_78);
    }
    StreamSepMaker::rm_beg(&local_408,es,2);
    StreamSepMaker::operator<<(&local_380,&local_408,(char (*) [3])0x178133);
    pSVar4 = StreamSep::operator<<(&local_380,&cont_label);
    pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [2])0x1776d7);
    bVar1 = cpp_emitter->trace_labels;
    if (bVar1 == true) {
      to_string<unsigned_int>(&local_2d8,&cont_label);
      std::operator+(&local_2f8," std::cout << \"c_",&local_2d8);
      std::operator+(&local_428,&local_2f8," \" << __LINE__ << std::endl;");
    }
    else {
      std::__cxx11::string::string((string *)&local_428,"",(allocator *)&local_2f8);
    }
    StreamSep::operator<<(pSVar4,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    if (bVar1 != false) {
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    StreamSep::~StreamSep(&local_380);
    StreamSepMaker::~StreamSepMaker(&local_408);
    if (((this->super_Instruction).field_0x174 == '\x01') &&
       (1 < (ulong)(((long)(this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x28))) {
      StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [21])"if ( ! buf ) goto l_");
      iVar2 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
      pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
      StreamSep::~StreamSep((StreamSep *)&local_408);
    }
    if (cpp_emitter->buffer_type == 0) {
      StreamSepMaker::operator<<
                ((StreamSep *)&local_408,es,
                 (char (*) [173])
                 "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_"
                );
      iVar2 = Instruction::get_id_gen
                        (((this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
      local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
      pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
      StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
    }
    else {
      uVar3 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar3 == 0) {
        StreamSepMaker::operator<<
                  ((StreamSep *)&local_408,es,
                   (char (*) [175])
                   "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                  );
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
        StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
      }
      else {
        StreamSepMaker::operator<<
                  ((StreamSep *)&local_408,es,
                   (char (*) [53])"while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, ");
        uVar3 = Instruction::need_buf_next(&this->super_Instruction);
        local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,uVar3 - 1);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(uint *)&local_380);
        pSVar4 = StreamSep::operator<<
                           (pSVar4,(char (*) [102])
                                   " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                           );
        local_428._M_dataplus._M_p._0_4_ =
             Instruction::get_id_gen
                       (((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        pSVar4 = StreamSep::operator<<(pSVar4,(int *)&local_428);
        StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
      }
    }
    StreamSep::~StreamSep((StreamSep *)&local_408);
    bVar1 = CppEmitter::interruptible(cpp_emitter);
    ss = local_430;
    uVar5 = ((long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->super_Instruction).next.
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
    if (bVar1) {
      if (1 < uVar5) {
        StreamSepMaker::operator<<
                  ((StreamSep *)&local_408,es,(char (*) [24])"if ( last_buf ) goto l_");
        iVar2 = Instruction::get_id_gen
                          ((this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
      }
      uVar3 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar3 == 0) {
        StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [27])0x177fc3);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,&cont_label);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
        StreamSepMaker::operator<<(&local_228,es,(char (*) [17])0x178009);
        StreamSep::~StreamSep(&local_228);
        StreamSepMaker::rm_beg(&local_408,es,2);
        StreamSepMaker::operator<<(&local_380,&local_408,(char (*) [3])0x178020);
        pSVar4 = StreamSep::operator<<(&local_380,&cont_label);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1776d7);
        StreamSep::~StreamSep(&local_380);
        StreamSepMaker::~StreamSepMaker(&local_408);
        StreamSepMaker::operator<<
                  ((StreamSep *)&local_408,es,(char (*) [29])"if ( data > end_m1 ) goto c_");
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,&cont_label);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
        StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [8])0x177f34);
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
      }
      else {
        std::__cxx11::string::string((string *)&local_408,"pending_buf",(allocator *)&local_338);
        std::__cxx11::string::string((string *)&local_380,"HPIPE_BUFF_T *",(allocator *)&local_318);
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        local_428._M_string_length = 0;
        local_428.field_2._M_local_buf[0] = '\0';
        CppEmitter::add_variable(cpp_emitter,(string *)&local_408,(string *)&local_380,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_408);
        StreamSepMaker::operator<<((StreamSep *)(local_108 + 0x48),es,(char (*) [30])0x177f50);
        StreamSep::~StreamSep((StreamSep *)(local_108 + 0x48));
        StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [27])0x177fc3);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,&cont_label);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
        uVar3 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar3 == 1) {
          pSVar6 = (StreamSepMaker *)local_108;
          StreamSepMaker::operator<<((StreamSep *)pSVar6,es,(char (*) [30])0x177f76);
        }
        else {
          StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [31])0x177f9c);
          uVar3 = Instruction::need_buf_next(&this->super_Instruction);
          local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,uVar3);
          pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(uint *)&local_380);
          StreamSep::operator<<(pSVar4,(char (*) [4])0x1775c1);
          pSVar6 = &local_408;
        }
        StreamSep::~StreamSep((StreamSep *)pSVar6);
        StreamSepMaker::operator<<(&local_150,es,(char (*) [17])0x178009);
        StreamSep::~StreamSep(&local_150);
        StreamSepMaker::rm_beg(&local_408,es,2);
        StreamSepMaker::operator<<(&local_380,&local_408,(char (*) [3])0x178020);
        pSVar4 = StreamSep::operator<<(&local_380,&cont_label);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [2])0x1776d7);
        bVar1 = cpp_emitter->trace_labels;
        if (bVar1 == true) {
          to_string<unsigned_int>(&local_318,&cont_label);
          std::operator+(&local_338," std::cout << \"e_",&local_318);
          std::operator+(&local_428,&local_338," \" << __LINE__ << std::endl;");
        }
        else {
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&local_338);
        }
        StreamSep::operator<<(pSVar4,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        if (bVar1 != false) {
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_318);
        }
        ss = local_430;
        StreamSep::~StreamSep(&local_380);
        StreamSepMaker::~StreamSepMaker(&local_408);
        StreamSepMaker::operator<<(&local_198,es,(char (*) [36])0x17805a);
        StreamSep::~StreamSep(&local_198);
        StreamSepMaker::operator<<(&local_1e0,es,(char (*) [30])0x177f50);
        StreamSep::~StreamSep(&local_1e0);
        StreamSepMaker::operator<<
                  ((StreamSep *)&local_408,es,(char (*) [29])"if ( data > end_m1 ) goto c_");
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,&cont_label);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
        StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [8])0x177f34);
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
      }
    }
    else {
      if (uVar5 < 2) goto LAB_0016e626;
      StreamSepMaker::operator<<((StreamSep *)&local_408,es,(char (*) [8])0x177f34);
      iVar2 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      local_380.stream = (TS *)CONCAT44(local_380.stream._4_4_,iVar2);
      pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(int *)&local_380);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
    }
    pSVar6 = &local_408;
  }
  else {
    uVar5 = ((long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->super_Instruction).next.
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
    if (cpp_emitter->buffer_type == 3) {
      if (1 < uVar5) {
        StreamSepMaker::operator<<((StreamSep *)&local_408,ss,(char (*) [7])"if ( *");
        local_380.stream = (TS *)0x17942f;
        if ((this->super_Instruction).field_0x174 != '\0') {
          local_380.stream = (TS *)0x179d38;
        }
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(char **)&local_380);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [5])0x178a34);
        pSVar4 = StreamSep::operator<<(pSVar4,&cpp_emitter->stop_char);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [11])0x178a03);
        local_428._M_dataplus._M_p._0_4_ =
             Instruction::get_id_gen
                       ((this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        pSVar4 = StreamSep::operator<<(pSVar4,(int *)&local_428);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
      }
      if ((this->super_Instruction).field_0x174 != '\0') goto LAB_0016e626;
      pSVar6 = (StreamSepMaker *)(local_2b8 + 0x48);
    }
    else {
      if (1 < uVar5) {
        StreamSepMaker::operator<<((StreamSep *)&local_408,ss,(char (*) [11])"if ( data ");
        local_380.stream = (TS *)0x178a39;
        if ((this->super_Instruction).field_0x174 != '\0') {
          local_380.stream = (TS *)0x176648;
        }
        pSVar4 = StreamSep::operator<<((StreamSep *)&local_408,(char **)&local_380);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x178299);
        local_428._M_dataplus._M_p._0_4_ =
             Instruction::get_id_gen
                       ((this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        pSVar4 = StreamSep::operator<<(pSVar4,(int *)&local_428);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep((StreamSep *)&local_408);
      }
      if ((this->super_Instruction).field_0x174 != '\0') goto LAB_0016e626;
      pSVar6 = (StreamSepMaker *)local_2b8;
    }
    StreamSepMaker::operator<<((StreamSep *)pSVar6,ss,(char (*) [8])"++data;");
  }
  StreamSep::~StreamSep((StreamSep *)pSVar6);
LAB_0016e626:
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionNextChar::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;
        ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto c_" << cont_label << ";"; // this one is good but it won't the case for the next
        if ( ! beg )
            ss << "++data;";

        // c_... (code when there is no data left in the buffer)
        es.rm_beg( 2 ) << "c_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"c_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        // es << "while ( buf->next ) {" << ( need_buf_next() > 1 ? " HPIPE_BUFF_T__INC_REF_N( buf, " + to_string( need_buf_next() - 1 ) + " );" : "" ) << " buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            es << "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else if ( need_buf_next() )
            es << "while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else
            es << "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";

        if ( cpp_emitter->interruptible() ) {
            if ( next.size() >= 2 )
                es << "if ( last_buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";

            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                if ( need_buf_next() == 1 )
                    es << "HPIPE_BUFF_T__INC_REF( buf );";
                else
                    es << "HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                es << "HPIPE_DATA.pending_buf->next = buf;";
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            } else {
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            }
        } else {
            if ( next.size() >= 2 )
                es << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next.size() >= 2 )
            ss << "if ( *" << ( beg ? "data" : "( data + 1 )" ) << " == " << cpp_emitter->stop_char << " ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    } else { // not interruptible
        if ( next.size() >= 2 )
            ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    }

    write_trans( ss, cpp_emitter );
}